

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_server2.c
# Opt level: O2

sni_entry * sni_parse(char *sni_string)

{
  char *path;
  char *path_00;
  char *s;
  int iVar1;
  sni_entry *head;
  char *pcVar2;
  mbedtls_x509_crt *pmVar3;
  mbedtls_pk_context *pmVar4;
  mbedtls_x509_crl *crl;
  sni_entry *head_00;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  
  pcVar9 = sni_string + -1;
  do {
    pcVar7 = pcVar9 + 1;
    pcVar9 = pcVar9 + 1;
  } while (*pcVar7 != '\0');
  *pcVar9 = ',';
  head_00 = (sni_entry *)0x0;
  while( true ) {
    if (pcVar9 < sni_string) {
      return head_00;
    }
    head = (sni_entry *)calloc(1,0x38);
    if (head == (sni_entry *)0x0) goto LAB_001117d2;
    head->name = sni_string;
    while (*sni_string != ',') {
      sni_string = sni_string + 1;
      if (pcVar9 < sni_string) goto LAB_001117c5;
    }
    *sni_string = '\0';
    pcVar7 = sni_string + 1;
    while (*pcVar7 != ',') {
      pcVar7 = pcVar7 + 1;
      if (pcVar9 < pcVar7) goto LAB_001117c5;
    }
    *pcVar7 = '\0';
    pcVar8 = pcVar7 + 1;
    while (*pcVar8 != ',') {
      pcVar8 = pcVar8 + 1;
      if (pcVar9 < pcVar8) goto LAB_001117c5;
    }
    *pcVar8 = '\0';
    path = pcVar8 + 1;
    pcVar6 = path;
    while (*pcVar6 != ',') {
      pcVar6 = pcVar6 + 1;
      if (pcVar9 < pcVar6) goto LAB_001117c5;
    }
    *pcVar6 = '\0';
    path_00 = pcVar6 + 1;
    pcVar5 = path_00;
    while (*pcVar5 != ',') {
      pcVar5 = pcVar5 + 1;
      if (pcVar9 < pcVar5) goto LAB_001117c5;
    }
    *pcVar5 = '\0';
    s = pcVar5 + 1;
    pcVar2 = s;
    while (*pcVar2 != ',') {
      pcVar2 = pcVar2 + 1;
      if (pcVar9 < pcVar2) goto LAB_001117c5;
    }
    *pcVar2 = '\0';
    pmVar3 = (mbedtls_x509_crt *)calloc(1,0x228);
    head->cert = pmVar3;
    if (pmVar3 == (mbedtls_x509_crt *)0x0) break;
    pmVar4 = (mbedtls_pk_context *)calloc(1,0x10);
    head->key = pmVar4;
    if (pmVar4 == (mbedtls_pk_context *)0x0) break;
    mbedtls_x509_crt_init(pmVar3);
    mbedtls_pk_init(head->key);
    iVar1 = mbedtls_x509_crt_parse_file(head->cert,sni_string + 1);
    if ((iVar1 != 0) ||
       (iVar1 = mbedtls_pk_parse_keyfile(head->key,pcVar7 + 1,anon_var_dwarf_30089 + 9), iVar1 != 0)
       ) break;
    if ((*path != '-') || (pcVar8[2] != '\0')) {
      pmVar3 = (mbedtls_x509_crt *)calloc(1,0x228);
      head->ca = pmVar3;
      if (pmVar3 != (mbedtls_x509_crt *)0x0) {
        mbedtls_x509_crt_init(pmVar3);
        iVar1 = mbedtls_x509_crt_parse_file(head->ca,path);
        if (iVar1 == 0) goto LAB_00111735;
      }
      break;
    }
LAB_00111735:
    if ((*path_00 != '-') || (pcVar6[2] != '\0')) {
      crl = (mbedtls_x509_crl *)calloc(1,0x1a0);
      head->crl = crl;
      if (crl != (mbedtls_x509_crl *)0x0) {
        mbedtls_x509_crl_init(crl);
        iVar1 = mbedtls_x509_crl_parse_file(head->crl,path_00);
        if (iVar1 == 0) goto LAB_00111786;
      }
      break;
    }
LAB_00111786:
    if ((*s == '-') && (pcVar5[2] == '\0')) {
      head->authmode = -1;
    }
    else {
      iVar1 = get_auth_mode(s);
      head->authmode = iVar1;
      if (iVar1 < 0) break;
    }
    sni_string = pcVar2 + 1;
    head->next = head_00;
    head_00 = head;
  }
LAB_001117c5:
  sni_free(head);
LAB_001117d2:
  sni_free(head_00);
  return (sni_entry *)0x0;
}

Assistant:

sni_entry *sni_parse( char *sni_string )
{
    sni_entry *cur = NULL, *new = NULL;
    char *p = sni_string;
    char *end = p;
    char *crt_file, *key_file, *ca_file, *crl_file, *auth_str;

    while( *end != '\0' )
        ++end;
    *end = ',';

    while( p <= end )
    {
        if( ( new = mbedtls_calloc( 1, sizeof( sni_entry ) ) ) == NULL )
        {
            sni_free( cur );
            return( NULL );
        }

        GET_ITEM( new->name );
        GET_ITEM( crt_file );
        GET_ITEM( key_file );
        GET_ITEM( ca_file );
        GET_ITEM( crl_file );
        GET_ITEM( auth_str );

        if( ( new->cert = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) ) ) == NULL ||
            ( new->key = mbedtls_calloc( 1, sizeof( mbedtls_pk_context ) ) ) == NULL )
            goto error;

        mbedtls_x509_crt_init( new->cert );
        mbedtls_pk_init( new->key );

        if( mbedtls_x509_crt_parse_file( new->cert, crt_file ) != 0 ||
            mbedtls_pk_parse_keyfile( new->key, key_file, "" ) != 0 )
            goto error;

        if( strcmp( ca_file, "-" ) != 0 )
        {
            if( ( new->ca = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) ) ) == NULL )
                goto error;

            mbedtls_x509_crt_init( new->ca );

            if( mbedtls_x509_crt_parse_file( new->ca, ca_file ) != 0 )
                goto error;
        }

        if( strcmp( crl_file, "-" ) != 0 )
        {
            if( ( new->crl = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl ) ) ) == NULL )
                goto error;

            mbedtls_x509_crl_init( new->crl );

            if( mbedtls_x509_crl_parse_file( new->crl, crl_file ) != 0 )
                goto error;
        }

        if( strcmp( auth_str, "-" ) != 0 )
        {
            if( ( new->authmode = get_auth_mode( auth_str ) ) < 0 )
                goto error;
        }
        else
            new->authmode = DFL_AUTH_MODE;

        new->next = cur;
        cur = new;
    }

    return( cur );

error:
    sni_free( new );
    sni_free( cur );
    return( NULL );
}